

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

void __thiscall
capnp::anon_unknown_1::CppTypeName::addMemberTemplate
          (CppTypeName *this,StringPtr innerName,
          Array<capnp::(anonymous_namespace)::CppTypeName> *params)

{
  undefined1 uVar1;
  char *pcVar2;
  size_t sVar3;
  StringTree *pSVar4;
  Branch *pBVar5;
  size_t sVar6;
  ArrayDisposer *pAVar7;
  CppTypeName *params_00;
  StringTree *pSVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  StringPtr delim;
  Array<kj::StringTree> result;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 uVar13;
  Array<kj::StringTree> local_138;
  undefined1 local_120 [16];
  char *local_110;
  ArrayDisposer *pAStack_108;
  Branch *local_100;
  Branch *local_f8;
  ArrayDisposer *pAStack_f0;
  ArrayDisposer *local_e8;
  char *local_e0;
  size_t local_d8;
  StringTree *local_d0;
  StringTree *local_c8;
  StringTree *local_c0;
  undefined8 *local_b8;
  undefined1 local_b0 [17];
  undefined7 uStack_9f;
  StringTree *local_98;
  Branch *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  size_t local_78;
  ArrayDisposer *local_70;
  StringTree local_68;
  
  local_d8 = innerName.content.size_;
  local_e0 = innerName.content.ptr;
  uVar1 = this->isArgDependent;
  this->needsTypename = (bool)uVar1;
  uVar13 = true;
  if (this->hasDisambiguatedTemplate_ == false) {
    uVar13 = uVar1;
  }
  local_120._0_8_ = "::";
  if ((bool)uVar1 != false) {
    local_120._0_8_ = "::template ";
  }
  this->hasDisambiguatedTemplate_ = (bool)uVar13;
  uVar13 = 0x3c;
  sVar3 = params->size_;
  pSVar4 = (StringTree *)0x0;
  local_138.ptr =
       (StringTree *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x38,0,sVar3,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_c0 = local_138.ptr + sVar3;
  local_b8 = &kj::_::HeapArrayDisposer::instance;
  pSVar8 = local_138.ptr;
  local_d0 = local_138.ptr;
  if (params->size_ != 0) {
    params_00 = params->ptr;
    do {
      if (params_00->isArgDependent == true) {
        this->isArgDependent = true;
      }
      if (params_00->hasInterfaces_ == true) {
        this->hasInterfaces_ = true;
      }
      if (params_00->hasDisambiguatedTemplate_ == true) {
        this->hasDisambiguatedTemplate_ = true;
      }
      if (params_00->needsTypename == true) {
        local_b0._0_8_ = "typename ";
        local_b0._8_8_ = (char *)0x9;
        local_c8 = pSVar8;
        kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
                  ((StringTree *)(local_b0 + 0x10),(StringTree *)local_b0,
                   (ArrayPtr<const_char> *)params_00,pSVar4);
        sVar3 = CONCAT71(uStack_9f,local_b0[0x10]);
        pSVar4 = local_98;
        pBVar5 = local_90;
        sVar6 = local_78;
        pAVar7 = local_70;
        uVar9 = local_88;
        uVar10 = uStack_84;
        uVar11 = uStack_80;
        uVar12 = uStack_7c;
      }
      else {
        sVar3 = (params_00->name).size_;
        pSVar4 = (StringTree *)(params_00->name).text.content.ptr;
        pBVar5 = (Branch *)(params_00->name).text.content.size_;
        (params_00->name).text.content.ptr = (char *)0x0;
        (params_00->name).text.content.size_ = 0;
        uVar9 = *(undefined4 *)&(params_00->name).text.content.disposer;
        uVar10 = *(undefined4 *)((long)&(params_00->name).text.content.disposer + 4);
        uVar11 = *(undefined4 *)&(params_00->name).branches.ptr;
        uVar12 = *(undefined4 *)((long)&(params_00->name).branches.ptr + 4);
        sVar6 = (params_00->name).branches.size_;
        pAVar7 = (params_00->name).branches.disposer;
        (params_00->name).branches.ptr = (Branch *)0x0;
        (params_00->name).branches.size_ = 0;
      }
      pSVar8->size_ = sVar3;
      (pSVar8->text).content.ptr = (char *)pSVar4;
      (pSVar8->text).content.size_ = (size_t)pBVar5;
      *(undefined4 *)&(pSVar8->text).content.disposer = uVar9;
      *(undefined4 *)((long)&(pSVar8->text).content.disposer + 4) = uVar10;
      *(undefined4 *)&(pSVar8->branches).ptr = uVar11;
      *(undefined4 *)((long)&(pSVar8->branches).ptr + 4) = uVar12;
      (pSVar8->branches).size_ = sVar6;
      (pSVar8->branches).disposer = pAVar7;
      pSVar8 = pSVar8 + 1;
      params_00 = params_00 + 1;
    } while (params_00 != params->ptr + params->size_);
  }
  local_138.size_ = ((long)pSVar8 - (long)local_138.ptr >> 3) * 0x6db6db6db6db6db7;
  local_138.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  delim.content.size_ = 3;
  delim.content.ptr = ", ";
  local_c8 = pSVar8;
  kj::StringTree::StringTree(&local_68,&local_138,delim);
  local_b0[0x10] = 0x3e;
  kj::strTree<kj::StringTree,char_const*,kj::StringPtr&,char,kj::StringTree,char>
            ((StringTree *)(local_120 + 8),(kj *)this,(StringTree *)local_120,&local_e0,
             (StringPtr *)&stack0xfffffffffffffec7,(char *)&local_68,(StringTree *)(local_b0 + 0x10)
             ,(char *)CONCAT17(uVar13,in_stack_fffffffffffffec0));
  (this->name).size_ = local_120._8_8_;
  pcVar2 = (this->name).text.content.ptr;
  if (pcVar2 != (char *)0x0) {
    sVar3 = (this->name).text.content.size_;
    (this->name).text.content.ptr = (char *)0x0;
    (this->name).text.content.size_ = 0;
    pAVar7 = (this->name).text.content.disposer;
    (**pAVar7->_vptr_ArrayDisposer)(pAVar7,pcVar2,1,sVar3,sVar3,0);
  }
  (this->name).text.content.ptr = local_110;
  (this->name).text.content.size_ = (size_t)pAStack_108;
  (this->name).text.content.disposer = (ArrayDisposer *)local_100;
  local_110 = (char *)0x0;
  pAStack_108 = (ArrayDisposer *)0x0;
  pBVar5 = (this->name).branches.ptr;
  if (pBVar5 != (Branch *)0x0) {
    sVar3 = (this->name).branches.size_;
    (this->name).branches.ptr = (Branch *)0x0;
    (this->name).branches.size_ = 0;
    pAVar7 = (this->name).branches.disposer;
    (**pAVar7->_vptr_ArrayDisposer)
              (pAVar7,pBVar5,0x40,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pAVar7 = pAStack_108;
  pcVar2 = local_110;
  (this->name).branches.ptr = local_f8;
  (this->name).branches.size_ = (size_t)pAStack_f0;
  (this->name).branches.disposer = local_e8;
  local_f8 = (Branch *)0x0;
  pAStack_f0 = (ArrayDisposer *)0x0;
  if (local_110 != (char *)0x0) {
    local_110 = (char *)0x0;
    pAStack_108 = (ArrayDisposer *)0x0;
    (**(_func_int **)local_100->index)(local_100,pcVar2,1,pAVar7,pAVar7,0);
  }
  sVar3 = local_68.branches.size_;
  pBVar5 = local_68.branches.ptr;
  if (local_68.branches.ptr != (Branch *)0x0) {
    local_68.branches.ptr = (Branch *)0x0;
    local_68.branches.size_ = 0;
    (**(local_68.branches.disposer)->_vptr_ArrayDisposer)
              (local_68.branches.disposer,pBVar5,0x40,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar3 = local_68.text.content.size_;
  pcVar2 = local_68.text.content.ptr;
  if (local_68.text.content.ptr != (char *)0x0) {
    local_68.text.content.ptr = (char *)0x0;
    local_68.text.content.size_ = 0;
    (**(local_68.text.content.disposer)->_vptr_ArrayDisposer)
              (local_68.text.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  sVar3 = local_138.size_;
  pSVar4 = local_138.ptr;
  if (local_138.ptr != (StringTree *)0x0) {
    local_138.ptr = (StringTree *)0x0;
    local_138.size_ = 0;
    (**(local_138.disposer)->_vptr_ArrayDisposer)
              (local_138.disposer,pSVar4,0x38,sVar3,sVar3,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  return;
}

Assistant:

void addMemberTemplate(kj::StringPtr innerName, kj::Array<CppTypeName>&& params) {
    // Append "::innerName<params, ...>".
    //
    // If necessary, add the "template" disambiguation keyword in front of `innerName`.

    bool parentIsArgDependent = isArgDependent;
    needsTypename = parentIsArgDependent;
    hasDisambiguatedTemplate_ = hasDisambiguatedTemplate_ || parentIsArgDependent;

    name = kj::strTree(kj::mv(name),
        parentIsArgDependent ? "::template " : "::",
        innerName, '<',
        kj::StringTree(KJ_MAP(p, params) {
          if (p.isArgDependent) isArgDependent = true;
          if (p.hasInterfaces_) hasInterfaces_ = true;
          if (p.hasDisambiguatedTemplate_) hasDisambiguatedTemplate_ = true;
          return kj::strTree(kj::mv(p));
        }, ", "),
        '>');
  }